

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void av1_init_second_pass(AV1_COMP *cpi)

{
  double dVar1;
  void *__dest;
  FIRSTPASS_STATS *in_RDI;
  FIRSTPASS_STATS *this_frame;
  double dVar2;
  FIRSTPASS_STATS *unaff_retaddr;
  FIRSTPASS_STATS *in_stack_00000008;
  double modified_error_total;
  FIRSTPASS_STATS *s;
  double avg_error;
  FIRSTPASS_STATS *stats;
  double frame_rate;
  FRAME_INFO *frame_info;
  TWO_PASS *twopass;
  AV1EncoderConfig *oxcf;
  double in_stack_ffffffffffffffa8;
  AV1_COMP *in_stack_ffffffffffffffb0;
  AV1EncoderConfig *oxcf_00;
  TWO_PASS *twopass_00;
  FRAME_INFO *frame_info_00;
  aom_internal_error_info *error_info;
  
  error_info = (aom_internal_error_info *)&in_RDI[0x490].new_mv_count;
  dVar1 = in_RDI->frame;
  if (*(long *)(*(long *)((long)dVar1 + 0x5d58) + 8) != 0) {
    mark_flashes((FIRSTPASS_STATS *)**(undefined8 **)((long)dVar1 + 0x5d58),
                 *(FIRSTPASS_STATS **)(*(long *)((long)dVar1 + 0x5d58) + 8));
    estimate_noise(unaff_retaddr,in_RDI,error_info);
    estimate_coeff((FIRSTPASS_STATS *)modified_error_total,in_stack_00000008);
    __dest = *(void **)(*(long *)((long)dVar1 + 0x5d58) + 0x18);
    memcpy(__dest,*(void **)(*(long *)((long)dVar1 + 0x5d58) + 8),0xe8);
    memcpy(*(void **)(*(long *)((long)dVar1 + 0x5d58) + 0x20),__dest,0xe8);
    av1_new_framerate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    *(long *)((long)dVar1 + 0x8ad8) =
         (long)((*(double *)((long)__dest + 0xa8) * (double)*(long *)(error_info->detail + 0x80)) /
               10000000.0);
    *(undefined4 *)((long)dVar1 + 0x8b18) = 1;
    oxcf_00 = *(AV1EncoderConfig **)((long)__dest + 0x20);
    if (0.0 < *(double *)((long)__dest + 0xb0) || *(double *)((long)__dest + 0xb0) == 0.0) {
      this_frame = (FIRSTPASS_STATS *)(*(double *)((long)__dest + 0xb0) + 1e-06);
    }
    else {
      this_frame = (FIRSTPASS_STATS *)(*(double *)((long)__dest + 0xb0) - 1e-06);
    }
    frame_info_00 = (FRAME_INFO *)in_RDI[0xada].MVrv;
    twopass_00 = (TWO_PASS *)0x0;
    *(double *)((long)dVar1 + 0x8ae0) =
         (((double)oxcf_00 / (double)this_frame) * (double)*(int *)(error_info->detail + 0xbc)) /
         100.0;
    *(double *)((long)dVar1 + 0x8ae8) =
         (((double)oxcf_00 / (double)this_frame) * (double)*(int *)(error_info->detail + 0xc0)) /
         100.0;
    for (; frame_info_00 < *(FRAME_INFO **)(*(long *)((long)dVar1 + 0x5d58) + 8);
        frame_info_00 = (FRAME_INFO *)&frame_info_00[5].subsampling_x) {
      dVar2 = calculate_modified_err(frame_info_00,twopass_00,oxcf_00,this_frame);
      twopass_00 = (TWO_PASS *)(dVar2 + (double)twopass_00);
    }
    *(TWO_PASS **)((long)dVar1 + 0x8af0) = twopass_00;
    *(undefined8 *)((long)in_RDI->frame + 0xad48) = 0;
    *(undefined8 *)((long)in_RDI->frame + 0xad50) = 0;
    *(undefined4 *)((long)in_RDI->frame + 0xad40) = 0;
    *(undefined4 *)((long)dVar1 + 0x8b1c) = 100;
    *(undefined4 *)((long)dVar1 + 0x8b20) = 100;
    *(undefined8 *)((long)dVar1 + 0x8b08) = 0x3ff0000000000000;
    *(undefined4 *)((long)dVar1 + 0x8b10) = 1;
    *(undefined4 *)((long)dVar1 + 0x8b14) = 1;
  }
  return;
}

Assistant:

void av1_init_second_pass(AV1_COMP *cpi) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  double frame_rate;
  FIRSTPASS_STATS *stats;

  if (!twopass->stats_buf_ctx->stats_in_end) return;

  mark_flashes(twopass->stats_buf_ctx->stats_in_start,
               twopass->stats_buf_ctx->stats_in_end);
  estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                 twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
  estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                 twopass->stats_buf_ctx->stats_in_end);

  stats = twopass->stats_buf_ctx->total_stats;

  *stats = *twopass->stats_buf_ctx->stats_in_end;
  *twopass->stats_buf_ctx->total_left_stats = *stats;

  frame_rate = 10000000.0 * stats->count / stats->duration;
  // Each frame can have a different duration, as the frame rate in the source
  // isn't guaranteed to be constant. The frame rate prior to the first frame
  // encoded in the second pass is a guess. However, the sum duration is not.
  // It is calculated based on the actual durations of all frames from the
  // first pass.
  av1_new_framerate(cpi, frame_rate);
  twopass->bits_left =
      (int64_t)(stats->duration * oxcf->rc_cfg.target_bandwidth / 10000000.0);

#if CONFIG_BITRATE_ACCURACY
  av1_vbr_rc_init(&cpi->vbr_rc_info, twopass->bits_left,
                  (int)round(stats->count));
#endif

#if CONFIG_RATECTRL_LOG
  rc_log_init(&cpi->rc_log);
#endif

  // This variable monitors how far behind the second ref update is lagging.
  twopass->sr_update_lag = 1;

  // Scan the first pass file and calculate a modified total error based upon
  // the bias/power function used to allocate bits.
  {
    const double avg_error =
        stats->coded_error / DOUBLE_DIVIDE_CHECK(stats->count);
    const FIRSTPASS_STATS *s = cpi->twopass_frame.stats_in;
    double modified_error_total = 0.0;
    twopass->modified_error_min =
        (avg_error * oxcf->rc_cfg.vbrmin_section) / 100;
    twopass->modified_error_max =
        (avg_error * oxcf->rc_cfg.vbrmax_section) / 100;
    while (s < twopass->stats_buf_ctx->stats_in_end) {
      modified_error_total +=
          calculate_modified_err(frame_info, twopass, oxcf, s);
      ++s;
    }
    twopass->modified_error_left = modified_error_total;
  }

  // Reset the vbr bits off target counters
  cpi->ppi->p_rc.vbr_bits_off_target = 0;
  cpi->ppi->p_rc.vbr_bits_off_target_fast = 0;

  cpi->ppi->p_rc.rate_error_estimate = 0;

  // Static sequence monitor variables.
  twopass->kf_zeromotion_pct = 100;
  twopass->last_kfgroup_zeromotion_pct = 100;

  // Initialize bits per macro_block estimate correction factor.
  twopass->bpm_factor = 1.0;
  // Initialize actual and target bits counters for ARF groups so that
  // at the start we have a neutral bpm adjustment.
  twopass->rolling_arf_group_target_bits = 1;
  twopass->rolling_arf_group_actual_bits = 1;
}